

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_type_get_contents_
               (MPIABI_Fint *datatype,MPIABI_Fint *max_integers,MPIABI_Fint *max_addresses,
               MPIABI_Fint *max_datatypes,int *array_of_integers,MPIABI_Fint *array_of_addresses,
               MPIABI_Fint *array_of_datatypes,MPIABI_Fint *ierror)

{
  mpi_type_get_contents_();
  return;
}

Assistant:

void mpiabi_type_get_contents_(
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * max_integers,
  const MPIABI_Fint * max_addresses,
  const MPIABI_Fint * max_datatypes,
  int * array_of_integers,
  MPIABI_Fint * array_of_addresses,
  MPIABI_Fint * array_of_datatypes,
  MPIABI_Fint * ierror
) {
  return mpi_type_get_contents_(
    datatype,
    max_integers,
    max_addresses,
    max_datatypes,
    array_of_integers,
    array_of_addresses,
    array_of_datatypes,
    ierror
  );
}